

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status
filemgr_write_offset
          (filemgr *file,bid_t bid,uint64_t offset,uint64_t len,void *buf,bool final_write,
          err_log_callback *log_callback)

{
  plock *plock;
  uint uVar1;
  bool bVar2;
  fdb_status io_error;
  uint32_t uVar3;
  int iVar4;
  plock_entry_t *plock_entry;
  void *buf_00;
  ulong uVar5;
  char *pcVar6;
  size_t line_number;
  ulong uVar7;
  char *format;
  char *pcVar8;
  bid_t bid_local;
  uint local_3c;
  bid_t is_writer;
  
  pcVar8 = (char *)(file->last_commit).super___atomic_base<unsigned_long>._M_i;
  bid_local = bid;
  if ((ulong)file->blocksize < len + offset) {
    uVar7 = 0xfffffffffffffffc;
    fdb_log_impl(log_callback,2,FDB_RESULT_WRITE_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_write_offset",0x8bc,
                 "Write error: trying to write the buffer data (offset: %lu, len: %lu that exceeds the block size %lu in a database file \'%s\'\n"
                 ,offset,len,(ulong)file->blocksize,file->filename);
    goto LAB_0012b035;
  }
  pcVar6 = (char *)(file->blocksize * bid + offset);
  if ((file->sb == (superblock *)0x0) ||
     ((file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i == 0)) {
    if ((pcVar8 <= pcVar6) ||
       ((file->sb != (superblock *)0x0 &&
        (pcVar6 < (char *)(ulong)((uint)file->sb->config->num_sb * file->blocksize)))))
    goto LAB_0012aeac;
    line_number = 0x8d3;
    format = 
    "Write error: trying to write at the offset %lu that is smaller than the current commit offset %lu in a database file \'%s\'\n"
    ;
  }
  else {
    bVar2 = (*sb_ops.is_writable)(file,bid);
    if (bVar2) {
LAB_0012aeac:
      if (global_config.ncacheblock < 1) {
        if ((file->blocksize == len) && (*(char *)((long)buf + (len - 1)) == -1)) {
          *(undefined8 *)((long)buf + 8) = 0xffffffffffffffff;
          uVar3 = get_checksum((uint8_t *)buf,(ulong)file->blocksize,file->crc_mode);
          *(uint32_t *)((long)buf + 8) =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        }
        uVar5 = (*file->ops->pwrite)(file->fd,buf,len,(cs_off_t)pcVar6);
        _log_errno_str(file->ops,log_callback,(fdb_status)uVar5,"WRITE",file->filename);
        uVar7 = 0;
        if (uVar5 != len) {
          uVar7 = 0xfffffffffffffffc;
          if ((long)uVar5 < 0) {
            uVar7 = uVar5;
          }
          uVar7 = uVar7 & 0xffffffff;
        }
        goto LAB_0012b035;
      }
      is_writer = 1;
      plock = &file->plock;
      plock_entry = plock_lock(plock,&bid_local,&is_writer);
      if (file->blocksize == len) {
        io_error = bcache_write(file,bid_local,buf,BCACHE_REQ_DIRTY,final_write,false);
        if (io_error != global_config.blocksize) {
          plock_unlock(plock,plock_entry);
LAB_0012af24:
          _log_errno_str(file->ops,log_callback,io_error,"WRITE",file->filename);
          uVar7 = 0xfffffffc;
          if (io_error < FDB_RESULT_SUCCESS) {
            uVar7 = (ulong)(uint)io_error;
          }
          goto LAB_0012b035;
        }
      }
      else {
        iVar4 = bcache_write_partial(file,bid_local,buf,offset,len,final_write);
        if (iVar4 == 0) {
          uVar7 = (*file->ops->goto_eof)(file->fd);
          if ((long)uVar7 < 0) {
            _log_errno_str(file->ops,log_callback,(fdb_status)uVar7,"EOF",file->filename);
            goto LAB_0012b035;
          }
          uVar1 = file->blocksize;
          local_3c = (uint)final_write;
          buf_00 = _filemgr_get_temp_buf();
          if ((bid_local < uVar7 / uVar1) &&
             (uVar5 = filemgr_read_block(file,buf_00,bid_local), uVar5 != file->blocksize)) {
            plock_unlock(plock,plock_entry);
            _filemgr_release_temp_buf(buf_00);
            _log_errno_str(file->ops,log_callback,(fdb_status)uVar5,"READ",file->filename);
            uVar7 = 0xfffffffffffffffb;
            if ((long)uVar5 < 0) {
              uVar7 = uVar5;
            }
            uVar7 = uVar7 & 0xffffffff;
            goto LAB_0012b035;
          }
          memcpy((void *)((long)buf_00 + offset),buf,len);
          io_error = bcache_write(file,bid_local,buf_00,BCACHE_REQ_DIRTY,SUB41(local_3c,0),false);
          if (io_error != global_config.blocksize) {
            plock_unlock(plock,plock_entry);
            _filemgr_release_temp_buf(buf_00);
            goto LAB_0012af24;
          }
          _filemgr_release_temp_buf(buf_00);
        }
      }
      plock_unlock(plock,plock_entry);
      uVar7 = 0;
      goto LAB_0012b035;
    }
    line_number = 0x8c7;
    pcVar8 = file->filename;
    format = 
    "Write error: trying to write at the offset %lu that is not identified as a reusable block in a database file \'%s\'\n"
    ;
  }
  uVar7 = 0xfffffffffffffffc;
  fdb_log_impl((err_log_callback *)0x0,1,FDB_RESULT_WRITE_FAIL,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
               ,"filemgr_write_offset",line_number,format,pcVar6,pcVar8);
LAB_0012b035:
  return (fdb_status)uVar7;
}

Assistant:

fdb_status filemgr_write_offset(struct filemgr *file, bid_t bid,
                                uint64_t offset, uint64_t len, void *buf,
                                bool final_write,
                                err_log_callback *log_callback)
{
    size_t lock_no;
    ssize_t r = 0;
    uint64_t pos = bid * file->blocksize + offset;
    uint64_t curr_commit_pos = atomic_get_uint64_t(&file->last_commit);

    if (offset + len > file->blocksize) {
        const char *msg = "Write error: trying to write the buffer data "
            "(offset: %" _F64 ", len: %" _F64 " that exceeds the block size "
            "%" _F64 " in a database file '%s'\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_WRITE_FAIL,
                msg, offset, len,
                file->blocksize, file->filename);
        return FDB_RESULT_WRITE_FAIL;
    }

    if (sb_bmp_exists(file->sb)) {
        // block reusing is enabled
        if (!sb_ops.is_writable(file, bid)) {
            const char *msg = "Write error: trying to write at the offset %" _F64 " that is "
                              "not identified as a reusable block in "
                              "a database file '%s'\n";
            fdb_log(NULL, FDB_LOG_FATAL, FDB_RESULT_WRITE_FAIL,
                    msg, pos, file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }
    } else if (pos < curr_commit_pos) {
        // stale blocks are not reused yet
        if (file->sb == NULL ||
            (file->sb && pos >= file->sb->config->num_sb * file->blocksize)) {
            // (non-sequential update is exceptionally allowed for superblocks)
            const char *msg = "Write error: trying to write at the offset %" _F64 " that is "
                              "smaller than the current commit offset %" _F64 " in "
                              "a database file '%s'\n";
            fdb_log(NULL, FDB_LOG_FATAL, FDB_RESULT_WRITE_FAIL,
                    msg, pos, curr_commit_pos, file->filename);
            return FDB_RESULT_WRITE_FAIL;
        }
    }

    if (global_config.ncacheblock > 0) {
        lock_no = bid % DLOCK_MAX;
        (void)lock_no;

        bool locked = false;
        plock_entry_t *plock_entry;
        bid_t is_writer = 1;
        plock_entry = plock_lock(&file->plock, &bid, &is_writer);
        locked = true;

        if (len == file->blocksize) {
            // write entire block .. we don't need to read previous block
            r = bcache_write(file, bid, buf, BCACHE_REQ_DIRTY, final_write, false);
            if (r != global_config.blocksize) {
                if (locked) {
                    plock_unlock(&file->plock, plock_entry);
                }
                _log_errno_str(file->ops, log_callback,
                               (fdb_status) r, "WRITE", file->filename);
                return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
            }
        } else {
            // partially write buffer cache first
            r = bcache_write_partial(file, bid, buf, offset, len, final_write);
            if (r == 0) {
                // cache miss
                // write partially .. we have to read previous contents of the block
                int64_t cur_file_pos = file->ops->goto_eof(file->fd);
                if (cur_file_pos < 0) {
                    _log_errno_str(file->ops, log_callback,
                                   (fdb_status) cur_file_pos, "EOF", file->filename);
                    return (fdb_status) cur_file_pos;
                }
                bid_t cur_file_last_bid = cur_file_pos / file->blocksize;
                void *_buf = _filemgr_get_temp_buf();

                if (bid >= cur_file_last_bid) {
                    // this is the first time to write this block
                    // we don't need to read previous block from file.
                } else {
                    r = filemgr_read_block(file, _buf, bid);
                    if (r != (ssize_t)file->blocksize) {
                        if (locked) {
                            plock_unlock(&file->plock, plock_entry);
                        }
                        _filemgr_release_temp_buf(_buf);
                        _log_errno_str(file->ops, log_callback, (fdb_status) r,
                                       "READ", file->filename);
                        return r < 0 ? (fdb_status) r : FDB_RESULT_READ_FAIL;
                    }
                }
                memcpy((uint8_t *)_buf + offset, buf, len);
                r = bcache_write(file, bid, _buf, BCACHE_REQ_DIRTY, final_write, false);
                if (r != global_config.blocksize) {
                    if (locked) {
                        plock_unlock(&file->plock, plock_entry);
                    }
                    _filemgr_release_temp_buf(_buf);
                    _log_errno_str(file->ops, log_callback,
                            (fdb_status) r, "WRITE", file->filename);
                    return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
                }

                _filemgr_release_temp_buf(_buf);
            } // cache miss
        } // full block or partial block

        if (locked) {
            plock_unlock(&file->plock, plock_entry);
        }
    } else { // block cache disabled

        if (len == file->blocksize) {
            uint8_t marker = *((uint8_t*)buf + file->blocksize - 1);
            if (marker == BLK_MARKER_BNODE) {
                memset((uint8_t *)buf + BTREE_CRC_OFFSET, 0xff, BTREE_CRC_FIELD_LEN);
                uint32_t crc32 = get_checksum(reinterpret_cast<const uint8_t*>(buf),
                                              file->blocksize,
                                              file->crc_mode);
                crc32 = _endian_encode(crc32);
                memcpy((uint8_t *)buf + BTREE_CRC_OFFSET, &crc32, sizeof(crc32));
            }
        }

        r = file->ops->pwrite(file->fd, buf, len, pos);
        _log_errno_str(file->ops, log_callback, (fdb_status) r, "WRITE", file->filename);
        if ((uint64_t)r != len) {
            return r < 0 ? (fdb_status) r : FDB_RESULT_WRITE_FAIL;
        }
    } // block cache check
    return FDB_RESULT_SUCCESS;
}